

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O0

int ngp_hdu_insert_token(NGP_HDU *ngph,NGP_TOKEN *newtok)

{
  size_t sVar1;
  void *pvVar2;
  int *in_RSI;
  int *in_RDI;
  NGP_TOKEN *tkp;
  void *local_20;
  int local_4;
  
  if (in_RDI == (int *)0x0) {
    local_4 = 0x16a;
  }
  else if (in_RSI == (int *)0x0) {
    local_4 = 0x16a;
  }
  else {
    if (*in_RDI == 0) {
      local_20 = malloc((long)(*in_RDI + 1) * 0xb0);
    }
    else {
      local_20 = realloc(*(void **)(in_RDI + 2),(long)(*in_RDI + 1) * 0xb0);
    }
    if (local_20 == (void *)0x0) {
      local_4 = 0x168;
    }
    else {
      *(void **)(in_RDI + 2) = local_20;
      memcpy((void *)(*(long *)(in_RDI + 2) + (long)*in_RDI * 0xb0),in_RSI,0xb0);
      if ((*in_RSI == 2) && (*(long *)(in_RSI + 0x14) != 0)) {
        sVar1 = strlen(*(char **)(in_RSI + 0x14));
        pvVar2 = malloc(sVar1 + 1);
        *(void **)(*(long *)(in_RDI + 2) + (long)*in_RDI * 0xb0 + 0x50) = pvVar2;
        if (*(long *)(*(long *)(in_RDI + 2) + (long)*in_RDI * 0xb0 + 0x50) == 0) {
          return 0x168;
        }
        strcpy(*(char **)(*(long *)(in_RDI + 2) + (long)*in_RDI * 0xb0 + 0x50),
               *(char **)(in_RSI + 0x14));
      }
      *in_RDI = *in_RDI + 1;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int	ngp_hdu_insert_token(NGP_HDU *ngph, NGP_TOKEN *newtok)
 { NGP_TOKEN *tkp;
   
   if (NULL == ngph) return(NGP_NUL_PTR);
   if (NULL == newtok) return(NGP_NUL_PTR);

   if (0 == ngph->tokcnt)
     tkp = (NGP_TOKEN *)ngp_alloc((ngph->tokcnt + 1) * sizeof(NGP_TOKEN));
   else
     tkp = (NGP_TOKEN *)ngp_realloc(ngph->tok, (ngph->tokcnt + 1) * sizeof(NGP_TOKEN));

   if (NULL == tkp) return(NGP_NO_MEMORY);
       
   ngph->tok = tkp;
   ngph->tok[ngph->tokcnt] = *newtok;

   if (NGP_TTYPE_STRING == newtok->type)
     { if (NULL != newtok->value.s)
         { ngph->tok[ngph->tokcnt].value.s = (char *)ngp_alloc(1 + strlen(newtok->value.s));
           if (NULL == ngph->tok[ngph->tokcnt].value.s) return(NGP_NO_MEMORY);
           strcpy(ngph->tok[ngph->tokcnt].value.s, newtok->value.s);
         }
     }

   ngph->tokcnt++;
   return(NGP_OK);
 }